

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_buffer(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_MPI ref_mpi_00;
  REF_NODE pRVar1;
  REF_DBL RVar2;
  uint uVar3;
  double dVar4;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_140;
  double local_138;
  REF_DBL local_130;
  double local_128;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL emax;
  REF_DBL emin;
  REF_DBL smax;
  REF_DBL smin;
  REF_DBL t;
  REF_DBL s;
  REF_DBL hmin;
  REF_DBL exponent;
  REF_DBL xmax;
  REF_DBL x;
  REF_DBL rmax;
  REF_DBL r;
  double dStack_a0;
  REF_INT node;
  REF_DBL eig;
  REF_DBL diag_system [12];
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_mpi_00 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  exponent = -1e-100;
  x = 0.0;
  for (r._4_4_ = 0; r._4_4_ < ref_grid->node->max; r._4_4_ = r._4_4_ + 1) {
    if (((-1 < r._4_4_) && (r._4_4_ < ref_grid->node->max)) &&
       (-1 < ref_grid->node->global[r._4_4_])) {
      rmax = sqrt(pRVar1->real[r._4_4_ * 0xf + 2] * pRVar1->real[r._4_4_ * 0xf + 2] +
                  pRVar1->real[r._4_4_ * 0xf] * pRVar1->real[r._4_4_ * 0xf] +
                  pRVar1->real[r._4_4_ * 0xf + 1] * pRVar1->real[r._4_4_ * 0xf + 1]);
      local_128 = rmax;
      if (rmax < x) {
        local_128 = x;
      }
      x = local_128;
      if (exponent < pRVar1->real[r._4_4_ * 0xf] || exponent == pRVar1->real[r._4_4_ * 0xf]) {
        local_130 = pRVar1->real[r._4_4_ * 0xf];
      }
      else {
        local_130 = exponent;
      }
      exponent = local_130;
    }
  }
  rmax = x;
  metric_local._4_4_ = ref_mpi_max(ref_mpi_00,&rmax,&x,3);
  if (metric_local._4_4_ == 0) {
    metric_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&x,1,3);
    if (metric_local._4_4_ == 0) {
      xmax = exponent;
      metric_local._4_4_ = ref_mpi_max(ref_mpi_00,&xmax,&exponent,3);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&exponent,1,3);
        if (metric_local._4_4_ == 0) {
          for (r._4_4_ = 0; r._4_4_ < ref_grid->node->max; r._4_4_ = r._4_4_ + 1) {
            if (((-1 < r._4_4_) && (r._4_4_ < ref_grid->node->max)) &&
               (-1 < ref_grid->node->global[r._4_4_])) {
              uVar3 = ref_matrix_diag_m(metric + r._4_4_ * 6,&eig);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x881,"ref_metric_buffer",(ulong)uVar3,"eigen decomp");
                return uVar3;
              }
              rmax = sqrt(pRVar1->real[r._4_4_ * 0xf + 2] * pRVar1->real[r._4_4_ * 0xf + 2] +
                          pRVar1->real[r._4_4_ * 0xf] * pRVar1->real[r._4_4_ * 0xf] +
                          pRVar1->real[r._4_4_ * 0xf + 1] * pRVar1->real[r._4_4_ * 0xf + 1]);
              RVar2 = x;
              if (rmax / exponent <= 1.0) {
                local_138 = rmax / exponent;
              }
              else {
                local_138 = 1.0;
              }
              if (1.0 <= local_138 / 0.5) {
                local_140 = 1.0;
              }
              else {
                local_140 = local_138 / 0.5;
              }
              hmin = (1.0 - local_140) * -15.0 + local_140 * -4.0;
              if ((0.5 < local_138) && (local_138 < 0.9)) {
                dVar4 = (local_138 - 0.5) / 0.4;
                hmin = (1.0 - dVar4) * -4.0 + dVar4 * -1.0;
              }
              if (0.9 <= local_138) {
                hmin = -1.0;
              }
              dVar4 = pow(10.0,hmin);
              dVar4 = RVar2 * dVar4;
              if (dVar4 * 1e+20 * dVar4 <= 0.0) {
                local_150 = -(dVar4 * 1e+20 * dVar4);
              }
              else {
                local_150 = dVar4 * 1e+20 * dVar4;
              }
              if (1.0 < local_150) {
                dStack_a0 = 1.0 / (dVar4 * dVar4);
                local_158 = dStack_a0;
                if (eig < dStack_a0) {
                  local_158 = eig;
                }
                eig = local_158;
                local_160 = dStack_a0;
                if (diag_system[0] < dStack_a0) {
                  local_160 = diag_system[0];
                }
                diag_system[0] = local_160;
                local_168 = dStack_a0;
                if (diag_system[1] < dStack_a0) {
                  local_168 = diag_system[1];
                }
                diag_system[1] = local_168;
              }
              uVar3 = ref_matrix_form_m(&eig,metric + r._4_4_ * 6);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x8a3,"ref_metric_buffer",(ulong)uVar3,"reform m");
                return uVar3;
              }
            }
          }
          metric_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x87e,"ref_metric_buffer",(ulong)metric_local._4_4_,"bcast");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x87d,"ref_metric_buffer",(ulong)metric_local._4_4_,"mpi max");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x87b,"ref_metric_buffer",(ulong)metric_local._4_4_,"bcast");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x87a,
           "ref_metric_buffer",(ulong)metric_local._4_4_,"mpi max");
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer(REF_DBL *metric, REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  REF_DBL r, rmax, x, xmax, exponent, hmin, s, t, smin, smax, emin, emax;

  xmax = -1.0e-100;
  rmax = 0.0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));
    rmax = MAX(rmax, r);
    xmax = MAX(xmax, ref_node_xyz(ref_node, 0, node));
  }
  r = rmax;
  RSS(ref_mpi_max(ref_mpi, &r, &rmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &rmax, 1, REF_DBL_TYPE), "bcast");
  x = xmax;
  RSS(ref_mpi_max(ref_mpi, &x, &xmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &xmax, 1, REF_DBL_TYPE), "bcast");

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");

    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));

    smin = 0.5;
    smax = 0.9;
    emin = -4.0;
    emax = -1.0;

    s = MIN(1.0, r / xmax);

    t = MIN(s / smin, 1.0);
    exponent = -15.0 * (1.0 - t) + emin * t;

    if (smin < s && s < smax) {
      t = (s - smin) / (smax - smin);
      exponent = (emin) * (1.0 - t) + (emax) * (t);
    }

    if (smax <= s) {
      exponent = emax;
    }

    hmin = rmax * pow(10.0, exponent);

    if (ref_math_divisible(1.0, hmin * hmin)) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}